

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-context.cpp
# Opt level: O2

int __thiscall llama_context::decode(llama_context *this,llama_batch *inp_batch)

{
  llama_sbatch *this_00;
  _Rb_tree_header *p_Var1;
  uint uVar2;
  llama_model *plVar3;
  llama_kv_cache_unified *plVar4;
  pointer plVar5;
  pointer plVar6;
  pointer piVar7;
  llama_batch in_batch;
  bool bVar8;
  byte bVar9;
  llama_pos lVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  int32_t iVar13;
  ggml_status gVar14;
  int iVar15;
  int64_t iVar16;
  llama_ubatch *ubatch_00;
  long lVar17;
  long lVar18;
  long lVar19;
  iterator iVar20;
  mapped_type *pmVar21;
  runtime_error *this_01;
  uint uVar22;
  char *pcVar23;
  long lVar24;
  undefined8 uVar25;
  ulong uVar26;
  long lVar27;
  uint32_t s;
  byte bVar28;
  long lVar29;
  float fVar30;
  float fVar31;
  llama_seq_id seq_id;
  int local_1fc;
  map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
  *local_1f8;
  long local_1f0;
  char *local_1e8;
  ulong local_1e0;
  long local_1d8;
  llama_kv_cache_guard kv_guard;
  llama_ubatch ubatch;
  char *local_180;
  char *local_178;
  undefined1 local_150 [104];
  pointer local_e8;
  pointer puStack_e0;
  pointer local_d8;
  llama_batch_allocr batch_allocr;
  
  if (inp_batch->n_tokens == 0) {
    llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: n_tokens == 0\n","decode");
    return -1;
  }
  local_d8 = (pointer)inp_batch->logits;
  local_150._72_4_ = inp_batch->n_tokens;
  local_150._76_4_ = *(undefined4 *)&inp_batch->field_0x4;
  local_150._80_8_ = inp_batch->token;
  local_150._88_8_ = inp_batch->embd;
  local_150._96_8_ = inp_batch->pos;
  local_e8 = (pointer)inp_batch->n_seq_id;
  puStack_e0 = (pointer)inp_batch->seq_id;
  if (inp_batch->pos == (llama_pos *)0x0) {
    lVar10 = llama_kv_cache_unified::pos_max
                       ((this->kv_self)._M_t.
                        super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                        .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl);
    lVar10 = lVar10 + 1;
  }
  else {
    lVar10 = -1;
  }
  in_batch.token = (llama_token *)local_150._80_8_;
  in_batch._0_8_ = local_150._72_8_;
  in_batch.embd = (float *)local_150._88_8_;
  in_batch.pos = (llama_pos *)local_150._96_8_;
  in_batch.n_seq_id = (int32_t *)local_e8;
  in_batch.seq_id = (llama_seq_id **)puStack_e0;
  in_batch.logits = (int8_t *)local_d8;
  llama_batch_allocr::llama_batch_allocr(&batch_allocr,in_batch,lVar10);
  plVar3 = this->model;
  uVar11 = llama_vocab::n_tokens(&plVar3->vocab);
  local_1d8 = (long)batch_allocr.batch.n_tokens;
  local_1e0 = (ulong)(plVar3->hparams).n_embd;
  kv_guard.kv = &((this->kv_self)._M_t.
                  super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                  .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->
                 super_llama_kv_cache;
  if (batch_allocr.batch.embd == (float *)0x0 || batch_allocr.batch.token != (llama_token *)0x0) {
    pcVar23 = "(!batch.token && batch.embd) || (batch.token && !batch.embd)";
    uVar25 = 0x4bb;
    if ((batch_allocr.batch.token == (llama_token *)0x0) ||
       (batch_allocr.batch.embd != (float *)0x0)) goto LAB_001d4813;
    lVar29 = 0;
    lVar19 = 0;
    if (0 < local_1d8) {
      lVar19 = local_1d8;
    }
    for (; lVar19 != lVar29; lVar29 = lVar29 + 1) {
      uVar22 = batch_allocr.batch.token[lVar29];
      if ((int)uVar22 < 0) {
LAB_001d478a:
        llama_log_internal(GGML_LOG_LEVEL_ERROR,"%s: invalid token[%ld] = %d\n","decode",lVar29,
                           (ulong)uVar22);
        this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_01,"invalid token");
        __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      uVar12 = llama_vocab::n_tokens(&this->model->vocab);
      if (uVar12 <= uVar22) {
        uVar22 = batch_allocr.batch.token[lVar29];
        goto LAB_001d478a;
      }
    }
  }
  lVar19 = local_1d8;
  if ((long)(ulong)(this->cparams).n_batch < local_1d8) {
    pcVar23 = "n_tokens_all <= cparams.n_batch";
    uVar25 = 0x4c6;
  }
  else {
    if (((this->cparams).causal_attn != false) ||
       (local_1d8 <= (long)(ulong)(this->cparams).n_ubatch)) {
      if (this->t_compute_start_us == 0) {
        iVar16 = ggml_time_us();
        this->t_compute_start_us = iVar16;
      }
      this->n_queued_tokens = this->n_queued_tokens + lVar19;
      bVar28 = (this->cparams).pooling_type != LLAMA_POOLING_TYPE_NONE & (this->cparams).embeddings;
      local_1f8 = &this->embd_seq;
      std::
      _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
      ::clear(&local_1f8->_M_t);
      if (batch_allocr.batch.logits == (int8_t *)0x0 || bVar28 != 0) {
        lVar29 = 1;
        if ((this->logits_all & 1U) != 0 || bVar28 != 0) {
          lVar29 = lVar19;
        }
      }
      else {
        lVar29 = 0;
        for (lVar27 = 0; lVar27 < lVar19; lVar27 = lVar27 + 1) {
          lVar29 = (lVar29 + 1) - (ulong)(batch_allocr.batch.logits[lVar27] == '\0');
        }
      }
      this_00 = &this->sbatch;
      llama_sbatch::from_batch
                (this_00,&batch_allocr.batch,local_1e0,
                 (bool)(((this->kv_self)._M_t.
                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->
                        recurrent ^ 1),lVar29 == lVar19);
      iVar13 = output_reserve(this,(int32_t)lVar29);
      if (iVar13 < lVar29) {
        llama_log_internal(GGML_LOG_LEVEL_ERROR,
                           "%s: could not reserve space for batch with %ld outputs\n","decode",
                           lVar29);
        local_1fc = -2;
      }
      else {
        kv_self_update(this);
        local_150._64_8_ = SEXT48((int)uVar11);
        p_Var1 = &(this->embd_seq)._M_t._M_impl.super__Rb_tree_header;
        lVar27 = local_1e0 * 4;
        local_1f0 = 0;
        local_178 = "backend_res != nullptr";
        local_1e8 = "n_outputs_prev + n_outputs <= n_outputs_all";
        local_180 = "backend_embd != nullptr";
        do {
          if (this_00->n_tokens == 0) {
            (*((kv_guard.kv)->super_llama_memory_i)._vptr_llama_memory_i[10])();
            plVar5 = (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_start;
            plVar6 = (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                     super__Vector_impl_data._M_finish;
            if ((long)plVar6 - (long)plVar5 >> 3 != lVar29) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                         ,0x59e,"GGML_ASSERT(%s) failed",
                         "sbatch.out_ids.size() == (size_t) n_outputs_all");
            }
            piVar7 = (this->output_ids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            lVar27 = 0;
            lVar19 = lVar29;
            if (lVar29 < 1) {
              lVar19 = lVar27;
            }
            bVar28 = 1;
            for (; lVar19 != lVar27; lVar27 = lVar27 + 1) {
              lVar17 = plVar5[lVar27];
              piVar7[lVar17] = (int)lVar27;
              bVar28 = bVar28 & lVar27 == lVar17;
            }
            if ((bool)(plVar6 != plVar5 & bVar28)) {
              (this->sbatch).out_ids.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_finish = plVar5;
            }
            this->n_outputs = (int32_t)lVar29;
            if ((this->cparams).causal_attn == true) {
              fVar31 = (this->cparams).defrag_thold;
              fVar30 = 0.0;
              if (0.0 < fVar31) {
                plVar4 = (this->kv_self)._M_t.
                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
                if (0x7ff < plVar4->n) {
                  uVar11 = plVar4->used;
                  uVar12 = llama_kv_cache_unified::get_padding(plVar4,&this->cparams);
                  fVar30 = 1.0 - (float)(uVar12 + uVar11) /
                                 (float)((this->kv_self)._M_t.
                                         super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                                         .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>.
                                        _M_head_impl)->n;
                  if (fVar30 <= 0.0) {
                    fVar30 = 0.0;
                  }
                  fVar31 = (this->cparams).defrag_thold;
                }
                if (fVar31 < fVar30) {
                  llama_log_internal(GGML_LOG_LEVEL_DEBUG,
                                     "%s: fragmentation: %.2f - requesting defrag\n",
                                     SUB84((double)fVar30,0),"decode");
                  (**(code **)((long)(((this->kv_self)._M_t.
                                       super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                                       .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>.
                                      _M_head_impl)->super_llama_kv_cache).super_llama_memory_i + 8)
                  )();
                }
              }
            }
            local_1fc = 0;
            ggml_backend_sched_reset
                      ((this->sched)._M_t.
                       super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                       super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                       super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
            break;
          }
          ubatch.seq_id = (llama_seq_id **)0x0;
          ubatch.output = (int8_t *)0x0;
          ubatch.pos = (llama_pos *)0x0;
          ubatch.n_seq_id = (int32_t *)0x0;
          ubatch.token = (llama_token *)0x0;
          ubatch.embd = (float *)0x0;
          ubatch.equal_seqs = false;
          ubatch._1_3_ = 0;
          ubatch.n_tokens = 0;
          ubatch.n_seq_tokens = 0;
          ubatch.n_seqs = 0;
          if (((this->kv_self)._M_t.
               super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
               ._M_t.
               super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
               .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->recurrent ==
              true) {
            if (bVar28 == 0) {
              llama_sbatch::split_equal
                        ((llama_ubatch *)local_150,this_00,(ulong)(this->cparams).n_ubatch);
            }
            else {
              llama_sbatch::split_seq
                        ((llama_ubatch *)local_150,this_00,(ulong)(this->cparams).n_ubatch);
            }
          }
          else {
            llama_sbatch::split_simple
                      ((llama_ubatch *)local_150,this_00,(ulong)(this->cparams).n_ubatch);
          }
          ubatch.seq_id = (llama_seq_id **)CONCAT44(local_150._52_4_,local_150._48_4_);
          ubatch.output = (int8_t *)CONCAT44(local_150._60_4_,local_150._56_4_);
          ubatch.n_tokens = local_150._4_4_;
          ubatch._8_8_ = (ulong)(uint)local_150._12_4_ << 0x20;
          uVar22 = local_150._4_4_;
          if (lVar29 != lVar19) {
            if (ubatch.output == (int8_t *)0x0) {
              ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                         ,0x50c,"GGML_ASSERT(%s) failed","ubatch.output");
            }
            uVar22 = 0;
            for (uVar26 = 0; (uint)local_150._4_4_ != uVar26; uVar26 = uVar26 + 1) {
              uVar22 = (uVar22 + 1) - (uint)(ubatch.output[uVar26] == '\0');
            }
          }
          this->n_outputs = uVar22;
          bVar8 = llama_kv_cache_unified::find_slot
                            ((this->kv_self)._M_t.
                             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl,
                             &ubatch);
          if (!bVar8) {
            llama_log_internal(GGML_LOG_LEVEL_WARN,
                               "%s: failed to find KV cache slot for ubatch of size %d\n","decode",
                               ubatch.n_tokens);
            local_1fc = 1;
            break;
          }
          plVar4 = (this->kv_self)._M_t.
                   super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                   .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
          if (plVar4->recurrent == false) {
            uVar11 = llama_kv_cache_unified::get_padding(plVar4,&this->cparams);
            plVar4 = (this->kv_self)._M_t.
                     super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
                     .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl;
            uVar12 = llama_kv_cache_unified::cell_max(plVar4);
            uVar22 = -uVar11 & (uVar12 + uVar11) - 1;
            if (uVar22 < uVar11) {
              uVar22 = uVar11;
            }
            uVar2 = plVar4->size;
            if (uVar2 <= uVar22) {
              uVar22 = uVar2;
            }
            ((this->kv_self)._M_t.
             super___uniq_ptr_impl<llama_kv_cache_unified,_std::default_delete<llama_kv_cache_unified>_>
             ._M_t.
             super__Tuple_impl<0UL,_llama_kv_cache_unified_*,_std::default_delete<llama_kv_cache_unified>_>
             .super__Head_base<0UL,_llama_kv_cache_unified_*,_false>._M_head_impl)->n = uVar22;
          }
          ggml_backend_sched_reset
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl);
          ggml_backend_sched_set_eval_callback
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                     (this->cparams).cb_eval,(this->cparams).cb_eval_user_data);
          ubatch_00 = (llama_ubatch *)graph_init(this);
          graph_build((llama_context *)local_150,(ggml_context *)this,
                      (ggml_cgraph *)
                      (this->ctx_compute)._M_t.
                      super___uniq_ptr_impl<ggml_context,_ggml_context_deleter>._M_t.
                      super__Tuple_impl<0UL,_ggml_context_*,_ggml_context_deleter>.
                      super__Head_base<0UL,_ggml_context_*,_false>._M_head_impl,ubatch_00,
                      (llm_graph_type)&ubatch);
          ggml_backend_sched_alloc_graph
                    ((this->sched)._M_t.
                     super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>._M_t.
                     super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>.
                     super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,ubatch_00);
          (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 0x28))
                    ((long *)CONCAT44(local_150._4_4_,local_150._0_4_),&ubatch);
          gVar14 = graph_compute(this,(ggml_cgraph *)ubatch_00,1 < ubatch.n_tokens);
          if (gVar14 == GGML_STATUS_SUCCESS) {
            bVar9 = (this->cparams).embeddings;
            if ((bool)bVar9 == false) {
              lVar19 = (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 0x10))();
              bVar9 = (this->cparams).embeddings;
            }
            else {
              lVar19 = 0;
            }
            if (((bVar9 & 1) == 0) ||
               (lVar17 = (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 0x18))(),
               lVar17 == 0)) {
              lVar17 = 0;
            }
            else {
              lVar18 = (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 0x20))();
              if (lVar18 != 0) {
                lVar17 = (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 0x20))();
              }
            }
            iVar15 = this->n_outputs;
            if (iVar15 < 1 || lVar19 == 0) {
LAB_001d4401:
              if ((lVar17 != 0) && (0 < iVar15)) {
                lVar19 = ggml_backend_sched_get_tensor_backend
                                   ((this->sched)._M_t.
                                    super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>
                                    .super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl
                                   );
                if (lVar19 == 0) {
                  uVar25 = 0x560;
LAB_001d4865:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                             ,uVar25,"GGML_ASSERT(%s) failed",local_180);
                }
                switch((this->cparams).pooling_type) {
                case LLAMA_POOLING_TYPE_NONE:
                  if (this->embd == (float *)0x0) {
                    uVar25 = 0x566;
                    local_180 = "embd != nullptr";
                    goto LAB_001d4865;
                  }
                  lVar18 = (long)this->n_outputs;
                  if (lVar18 != 0) {
                    if (lVar29 < local_1f0 + lVar18) {
                      uVar25 = 0x56a;
LAB_001d4920:
                      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                                 ,uVar25,"GGML_ASSERT(%s) failed",local_1e8);
                    }
                    lVar24 = (local_1f0 + lVar18) * local_1e0;
                    if (lVar24 - this->embd_size != 0 && (long)this->embd_size <= lVar24) {
                      uVar25 = 0x56b;
                      local_1e8 = "(n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size";
                      goto LAB_001d4920;
                    }
                    ggml_backend_tensor_get_async
                              (lVar19,lVar17,this->embd + local_1f0 * local_1e0,0,lVar18 * lVar27);
                  }
                  break;
                case LLAMA_POOLING_TYPE_MEAN:
                case LLAMA_POOLING_TYPE_CLS:
                case LLAMA_POOLING_TYPE_LAST:
                  for (uVar26 = 0; uVar26 < (ulong)ubatch._8_8_ >> 0x20; uVar26 = uVar26 + 1) {
                    seq_id = *ubatch.seq_id[uVar26];
                    iVar20 = std::
                             _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                             ::find(&local_1f8->_M_t,&seq_id);
                    if ((_Rb_tree_header *)iVar20._M_node == p_Var1) {
                      pmVar21 = std::
                                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                ::operator[](local_1f8,&seq_id);
                      std::vector<float,_std::allocator<float>_>::resize(pmVar21,local_1e0);
                      pmVar21 = std::
                                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                ::operator[](local_1f8,&seq_id);
                      ggml_backend_tensor_get_async
                                (lVar19,lVar17,
                                 (pmVar21->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
                    }
                  }
                  break;
                case LLAMA_POOLING_TYPE_RANK:
                  for (uVar26 = 0; uVar26 < (ulong)ubatch._8_8_ >> 0x20; uVar26 = uVar26 + 1) {
                    seq_id = *ubatch.seq_id[uVar26];
                    iVar20 = std::
                             _Rb_tree<int,_std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>,_std::_Select1st<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                             ::find(&local_1f8->_M_t,&seq_id);
                    if ((_Rb_tree_header *)iVar20._M_node == p_Var1) {
                      pmVar21 = std::
                                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                ::operator[](local_1f8,&seq_id);
                      std::vector<float,_std::allocator<float>_>::resize(pmVar21,1);
                      pmVar21 = std::
                                map<int,_std::vector<float,_std::allocator<float>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<float,_std::allocator<float>_>_>_>_>
                                ::operator[](local_1f8,&seq_id);
                      ggml_backend_tensor_get_async
                                (lVar19,lVar17,
                                 (pmVar21->super__Vector_base<float,_std::allocator<float>_>).
                                 _M_impl.super__Vector_impl_data._M_start,(long)seq_id << 2,4);
                    }
                  }
                  break;
                case LLAMA_POOLING_TYPE_UNSPECIFIED:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                             ,0x58f,"unknown pooling type");
                }
              }
            }
            else {
              lVar18 = ggml_backend_sched_get_tensor_backend
                                 ((this->sched)._M_t.
                                  super___uniq_ptr_impl<ggml_backend_sched,_ggml_backend_sched_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_ggml_backend_sched_*,_ggml_backend_sched_deleter>
                                  .super__Head_base<0UL,_ggml_backend_sched_*,_false>._M_head_impl,
                                  lVar19);
              if (lVar18 == 0) {
                uVar25 = 0x551;
LAB_001d4843:
                ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                           ,uVar25,"GGML_ASSERT(%s) failed",local_178);
              }
              if (this->logits == (float *)0x0) {
                uVar25 = 0x552;
                local_178 = "logits != nullptr";
                goto LAB_001d4843;
              }
              iVar15 = this->n_outputs;
              if ((long)iVar15 != 0) {
                lVar24 = local_1f0 + iVar15;
                if (lVar29 < lVar24) {
                  uVar25 = 0x557;
LAB_001d489a:
                  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
                             ,uVar25,"GGML_ASSERT(%s) failed",local_1e8);
                }
                lVar24 = lVar24 * local_150._64_8_;
                if (lVar24 - this->logits_size != 0 && (long)this->logits_size <= lVar24) {
                  uVar25 = 0x558;
                  local_1e8 = "(n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size";
                  goto LAB_001d489a;
                }
                ggml_backend_tensor_get_async
                          (lVar18,lVar19,this->logits + local_1f0 * local_150._64_8_,0,
                           (long)((int)local_150._64_8_ * iVar15) << 2);
                iVar15 = this->n_outputs;
                goto LAB_001d4401;
              }
            }
            local_1f0 = local_1f0 + this->n_outputs;
            lVar19 = local_1d8;
          }
          else if (gVar14 == GGML_STATUS_ALLOC_FAILED) {
            local_1fc = -2;
          }
          else if (gVar14 == GGML_STATUS_ABORTED) {
            local_1fc = 2;
          }
          else {
            local_1fc = -3;
          }
          if ((long *)CONCAT44(local_150._4_4_,local_150._0_4_) != (long *)0x0) {
            (**(code **)(*(long *)CONCAT44(local_150._4_4_,local_150._0_4_) + 8))();
          }
        } while (gVar14 == GGML_STATUS_SUCCESS);
      }
      llama_kv_cache_guard::~llama_kv_cache_guard(&kv_guard);
      llama_batch_allocr::~llama_batch_allocr(&batch_allocr);
      return local_1fc;
    }
    pcVar23 = 
    "(cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && \"non-causal attention requires n_ubatch >= n_tokens\""
    ;
    uVar25 = 0x4c8;
  }
LAB_001d4813:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/src/llama-context.cpp"
             ,uVar25,"GGML_ASSERT(%s) failed",pcVar23);
}

Assistant:

int llama_context::decode(llama_batch & inp_batch) {
    if (inp_batch.n_tokens == 0) {
        LLAMA_LOG_ERROR("%s: n_tokens == 0\n", __func__);
        return -1;
    }

    // temporary allocate memory for the input batch if needed
    // TODO: this is incorrect for multiple sequences because pos_max() is the maximum across all sequences
    llama_batch_allocr batch_allocr(inp_batch, inp_batch.pos ? -1 : kv_self->pos_max() + 1);

    const llama_batch & batch = batch_allocr.batch;

    const auto & vocab   = model.vocab;
    const auto & hparams = model.hparams;

    const int32_t n_vocab = vocab.n_tokens();

    const int64_t n_tokens_all = batch.n_tokens;
    const int64_t n_embd       = hparams.n_embd;

    llama_kv_cache_guard kv_guard(kv_self.get());

    GGML_ASSERT((!batch.token && batch.embd) || (batch.token && !batch.embd)); // NOLINT

    if (batch.token) {
        for (int64_t i = 0; i < n_tokens_all; ++i) {
            if (batch.token[i] < 0 || (uint32_t) batch.token[i] >= model.vocab.n_tokens()) {
                LLAMA_LOG_ERROR("%s: invalid token[%" PRId64 "] = %d\n", __func__, i, batch.token[i]);
                throw std::runtime_error("invalid token");
            }
        }
    }

    GGML_ASSERT(n_tokens_all <= cparams.n_batch);

    GGML_ASSERT((cparams.causal_attn || cparams.n_ubatch >= n_tokens_all) && "non-causal attention requires n_ubatch >= n_tokens");

    if (t_compute_start_us == 0) {
        t_compute_start_us = ggml_time_us();
    }
    n_queued_tokens += n_tokens_all;

    // this indicates we are doing pooled embedding, so we ignore batch.logits and output all tokens
    const bool embd_pooled = cparams.embeddings && cparams.pooling_type != LLAMA_POOLING_TYPE_NONE;

    embd_seq.clear();

    int64_t n_outputs_all = 0;

    // count outputs
    if (batch.logits && !embd_pooled) {
        for (uint32_t i = 0; i < n_tokens_all; ++i) {
            n_outputs_all += batch.logits[i] != 0;
        }
    } else if (logits_all || embd_pooled) {
        n_outputs_all = n_tokens_all;
    } else {
        // keep last output only
        n_outputs_all = 1;
    }

    const bool logits_all = n_outputs_all == n_tokens_all;

    sbatch.from_batch(batch, n_embd,
            /* simple_split */ !kv_self->recurrent,
            /* logits_all   */ logits_all);

    // reserve output buffer
    if (output_reserve(n_outputs_all) < n_outputs_all) {
        LLAMA_LOG_ERROR("%s: could not reserve space for batch with %" PRId64 " outputs\n", __func__, n_outputs_all);
        return -2;
    };

    // handle any pending defrags/shifts
    kv_self_update();

    int64_t n_outputs_prev = 0;

    while (sbatch.n_tokens > 0) {
        llama_ubatch ubatch = llama_ubatch();

        const auto & n_ubatch = cparams.n_ubatch;

        if (kv_self->recurrent) {
            if (embd_pooled) {
                // Pooled embeddings cannot be split across ubatches (yet)
                ubatch = sbatch.split_seq(cparams.n_ubatch);
            } else {
                // recurrent model architectures are easier to implement
                // with equal-length sequences
                ubatch = sbatch.split_equal(cparams.n_ubatch);
            }
        } else {
            ubatch = sbatch.split_simple(n_ubatch);
        }

        // count the outputs in this u_batch
        {
            int32_t n_outputs_new = 0;

            if (n_outputs_all == n_tokens_all) {
                n_outputs_new = ubatch.n_tokens;
            } else {
                GGML_ASSERT(ubatch.output);
                for (uint32_t i = 0; i < ubatch.n_tokens; i++) {
                    n_outputs_new += (int32_t) (ubatch.output[i] != 0);
                }
            }

            // needs to happen before the graph is built
            n_outputs = n_outputs_new;
        }

        // find KV slot
        {
            if (!kv_self->find_slot(ubatch)) {
                LLAMA_LOG_WARN("%s: failed to find KV cache slot for ubatch of size %d\n", __func__, ubatch.n_tokens);

                return 1;
            }

            if (!kv_self->recurrent) {
                // a heuristic, to avoid attending the full cache if it is not yet utilized
                // after enough generations, the benefit from this heuristic disappears
                // if we start defragmenting the cache, the benefit from this will be more important
                const uint32_t pad = kv_self->get_padding(cparams);
                kv_self->n = std::min(kv_self->size, std::max(pad, GGML_PAD(kv_self->cell_max(), pad)));
            }
        }

        //printf("kv_self.n = %5d, kv_self.used = %5d, kv_self.head = %5d\n", kv_self->n, kv_self->used, kv_self->head);

        ggml_backend_sched_reset(sched.get());
        ggml_backend_sched_set_eval_callback(sched.get(), cparams.cb_eval, cparams.cb_eval_user_data);

        auto * gf = graph_init();
        auto res = graph_build(ctx_compute.get(), gf, ubatch, LLM_GRAPH_TYPE_DECODER);

        // LLAMA_LOG_INFO("graph build time: %.3f ms (%d nodes, %d leafs)\n", (ggml_time_us() - t_start_us)/1000.0, gf->n_nodes, gf->n_leafs);

        ggml_backend_sched_alloc_graph(sched.get(), gf);

        res->set_inputs(&ubatch);

        const auto compute_status = graph_compute(gf, ubatch.n_tokens > 1);
        if (compute_status != GGML_STATUS_SUCCESS) {
            switch (compute_status) {
                case GGML_STATUS_ABORTED:
                    return 2;
                case GGML_STATUS_ALLOC_FAILED:
                    return -2;
                case GGML_STATUS_FAILED:
                default:
                    return -3;
            }
        }

        // plot the computation graph in dot format (for debugging purposes)
        //if (n_past%100 == 0) {
        //    ggml_graph_dump_dot(gf, NULL, "llama.dot");
        //}

        auto * t_logits = cparams.embeddings ? nullptr         : res->get_logits();
        auto * t_embd   = cparams.embeddings ? res->get_embd() : nullptr;

        if (t_embd && res->get_embd_pooled()) {
            t_embd = res->get_embd_pooled();
        }

        // extract logits
        if (t_logits && n_outputs > 0) {
            ggml_backend_t backend_res = ggml_backend_sched_get_tensor_backend(sched.get(), t_logits);
            GGML_ASSERT(backend_res != nullptr);
            GGML_ASSERT(logits != nullptr);

            float * logits_out = logits + n_outputs_prev*n_vocab;

            if (n_outputs) {
                GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                GGML_ASSERT((n_outputs_prev + n_outputs)*n_vocab <= (int64_t) logits_size);
                ggml_backend_tensor_get_async(backend_res, t_logits, logits_out, 0, n_outputs*n_vocab*sizeof(float));
            }
        }

        // extract embeddings
        if (t_embd && n_outputs > 0) {
            ggml_backend_t backend_embd = ggml_backend_sched_get_tensor_backend(sched.get(), t_embd);
            GGML_ASSERT(backend_embd != nullptr);

            switch (cparams.pooling_type) {
                case LLAMA_POOLING_TYPE_NONE:
                    {
                        // extract token embeddings
                        GGML_ASSERT(embd != nullptr);
                        float * embd_out = embd + n_outputs_prev*n_embd;

                        if (n_outputs) {
                            GGML_ASSERT( n_outputs_prev + n_outputs <= n_outputs_all);
                            GGML_ASSERT((n_outputs_prev + n_outputs)*n_embd <= (int64_t) embd_size);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_out, 0, n_outputs*n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_MEAN:
                case LLAMA_POOLING_TYPE_CLS:
                case LLAMA_POOLING_TYPE_LAST:
                    {
                        // extract sequence embeddings (cleared before processing each batch)
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(n_embd);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (n_embd*seq_id)*sizeof(float), n_embd*sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_RANK:
                    {
                        // extract the rerank score - a single float per sequence
                        auto & embd_seq_out = embd_seq;

                        for (uint32_t s = 0; s < ubatch.n_seqs; ++s) {
                            const llama_seq_id seq_id = ubatch.seq_id[s][0];
                            if (embd_seq_out.find(seq_id) != embd_seq_out.end()) {
                                continue;
                            }
                            embd_seq_out[seq_id].resize(1);
                            ggml_backend_tensor_get_async(backend_embd, t_embd, embd_seq_out[seq_id].data(), (seq_id)*sizeof(float), sizeof(float));
                        }
                    } break;
                case LLAMA_POOLING_TYPE_UNSPECIFIED:
                    {
                        GGML_ABORT("unknown pooling type");
                    }
            }
        }

        n_outputs_prev += n_outputs;
    }

    // finalize the batch processing
    kv_guard.commit();

    // set output mappings
    {
        bool sorted_output = true;

        GGML_ASSERT(sbatch.out_ids.size() == (size_t) n_outputs_all);

        for (int64_t i = 0; i < n_outputs_all; ++i) {
            int64_t out_id = sbatch.out_ids[i];
            output_ids[out_id] = i;
            if (out_id != i) {
                sorted_output = false;
            }
        }

        if (sorted_output) {
            sbatch.out_ids.clear();
        }
    }

    // set to total number of outputs in the batch, for use in llama_get_logits_ith
    n_outputs = n_outputs_all;

    // wait for the computation to finish (automatically done when obtaining the model output)
    //synchronize();

    // decide if we need to defrag the kv cache
    if (cparams.causal_attn && cparams.defrag_thold > 0.0f) {
        // - do not defrag small contexts (i.e. < 2048 tokens)
        // - count the padding towards the number of used tokens
        const float fragmentation = kv_self->n >= 2048 ? std::max(0.0f, 1.0f - float(kv_self->used + kv_self->get_padding(cparams))/float(kv_self->n)) : 0.0f;

        // queue defragmentation for next llama_kv_cache_update
        if (fragmentation > cparams.defrag_thold) {
            LLAMA_LOG_DEBUG("%s: fragmentation: %.2f - requesting defrag\n", __func__, fragmentation);

            kv_self->defrag();
        }
    }

    // Reset state for the next token before backend sync, to allow the CPU activities in the reset to
    // overlap with device computation.
    ggml_backend_sched_reset(sched.get());

    return 0;
}